

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool ON_BinaryArchive::ToggleByteOrder(size_t count,size_t sizeof_element,void *src,void *dst)

{
  ulong uVar1;
  ushort uVar2;
  undefined4 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [11];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  size_t sVar24;
  ushort *puVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auStack_29 [41];
  
  if (count != 0) {
    if (dst == (void *)0x0 || (src == (void *)0x0 || sizeof_element == 0)) {
      return false;
    }
    puVar25 = (ushort *)(count * sizeof_element + (long)dst);
    if (sizeof_element == 2) {
      for (; dst < puVar25; dst = (void *)((long)dst + 2)) {
        uVar2 = *src;
        src = (void *)((long)src + 2);
        *(ushort *)dst = uVar2 << 8 | uVar2 >> 8;
      }
    }
    else if (sizeof_element == 4) {
      for (; dst < puVar25; dst = (void *)((long)dst + 4)) {
        uVar3 = *src;
        src = (void *)((long)src + 4);
        auVar27._8_8_ = 0;
        auVar27._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        auVar27 = pshuflw(auVar27,auVar27,0x1b);
        sVar4 = auVar27._0_2_;
        sVar5 = auVar27._2_2_;
        sVar6 = auVar27._4_2_;
        sVar7 = auVar27._6_2_;
        *(uint *)dst = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                                CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6)
                                         ,CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] -
                                                   (0xff < sVar5),
                                                   (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] -
                                                   (0xff < sVar4))));
      }
    }
    else if (sizeof_element == 8) {
      for (; dst < puVar25; dst = (void *)((long)dst + 8)) {
        uVar1 = *src;
        src = (void *)((long)src + 8);
        auVar12._8_6_ = 0;
        auVar12._0_8_ = uVar1;
        auVar12[0xe] = (char)(uVar1 >> 0x38);
        auVar13._8_4_ = 0;
        auVar13._0_8_ = uVar1;
        auVar13[0xc] = (char)(uVar1 >> 0x30);
        auVar13._13_2_ = auVar12._13_2_;
        auVar14._8_4_ = 0;
        auVar14._0_8_ = uVar1;
        auVar14._12_3_ = auVar13._12_3_;
        auVar15._8_2_ = 0;
        auVar15._0_8_ = uVar1;
        auVar15[10] = (char)(uVar1 >> 0x28);
        auVar15._11_4_ = auVar14._11_4_;
        auVar16._8_2_ = 0;
        auVar16._0_8_ = uVar1;
        auVar16._10_5_ = auVar15._10_5_;
        auVar17[8] = (char)(uVar1 >> 0x20);
        auVar17._0_8_ = uVar1;
        auVar17._9_6_ = auVar16._9_6_;
        auVar26[7] = 0;
        auVar26._0_7_ = auVar17._8_7_;
        auVar20._7_8_ = 0;
        auVar20._0_7_ = auVar17._8_7_;
        auVar22._1_8_ = SUB158(auVar20 << 0x40,7);
        auVar22[0] = (char)(uVar1 >> 0x18);
        auVar22._9_6_ = 0;
        auVar21._1_10_ = SUB1510(auVar22 << 0x30,5);
        auVar21[0] = (char)(uVar1 >> 0x10);
        auVar23._11_4_ = 0;
        auVar23._0_11_ = auVar21;
        auVar18[2] = (char)(uVar1 >> 8);
        auVar18._0_2_ = (ushort)uVar1;
        auVar18._3_12_ = SUB1512(auVar23 << 0x20,3);
        auVar19._2_13_ = auVar18._2_13_;
        auVar19._0_2_ = (ushort)uVar1 & 0xff;
        auVar26._8_4_ = auVar19._0_4_;
        auVar26._12_4_ = auVar21._0_4_;
        auVar27 = pshuflw(auVar26,auVar26,0x1b);
        auVar27 = pshufhw(auVar27,auVar27,0x1b);
        sVar4 = auVar27._0_2_;
        sVar5 = auVar27._2_2_;
        sVar6 = auVar27._4_2_;
        sVar7 = auVar27._6_2_;
        sVar8 = auVar27._8_2_;
        sVar9 = auVar27._10_2_;
        sVar10 = auVar27._12_2_;
        sVar11 = auVar27._14_2_;
        *(ulong *)dst =
             CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11),
                      CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10),
                               CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9)
                                        ,CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar27[8] -
                                                  (0xff < sVar8),
                                                  CONCAT13((0 < sVar7) * (sVar7 < 0x100) *
                                                           auVar27[6] - (0xff < sVar7),
                                                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                    auVar27[4] - (0xff < sVar6),
                                                                    CONCAT11((0 < sVar5) *
                                                                             (sVar5 < 0x100) *
                                                                             auVar27[2] -
                                                                             (0xff < sVar5),
                                                                             (0 < sVar4) *
                                                                             (sVar4 < 0x100) *
                                                                             auVar27[0] -
                                                                             (0xff < sVar4))))))));
      }
    }
    else {
      if (0x1f < sizeof_element) {
        return false;
      }
      while (dst < puVar25) {
        for (sVar24 = 0; sizeof_element != sVar24; sVar24 = sVar24 + 1) {
          auStack_29[sVar24 + 1] = *(undefined1 *)((long)src + sVar24);
        }
        src = (void *)((long)src + sVar24);
        sVar24 = sizeof_element;
        while (sVar24 != 0) {
          *(undefined1 *)dst = auStack_29[sVar24];
          dst = (void *)((long)dst + 1);
          sVar24 = sVar24 - 1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ON_BinaryArchive::ToggleByteOrder(
  size_t count,          // number of elements
  size_t sizeof_element, // size of element (2,4, or 8)
  const void* src,    // source buffer
  void* dst           // destination buffer (can be same as source buffer)
  )
{
  bool rc = (0 == count || (count > 0 && sizeof_element > 0 && nullptr != src && nullptr != dst));
  if ( rc && count > 0 ) 
  {
    unsigned char c[32];
    const unsigned char* a = (const unsigned char*)src;
    unsigned char* b = (unsigned char*)dst;
    const unsigned char* b1 = b + (count*sizeof_element);

    // loops are unrolled and a switch is used
    // to speed things up a bit.
    switch(sizeof_element) 
    {
    case 2:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 4:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 8:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        c[4] = *a++;
        c[5] = *a++;
        c[6] = *a++;
        c[7] = *a++;
        *b++ = c[7];
        *b++ = c[6];
        *b++ = c[5];
        *b++ = c[4];
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    default:
      if ( sizeof_element < 32 )
      {
        // As of 2 May 2003, this case is never used
        // by core opennurbs objects.
        //
        // This is here so that future code will work
        // if and when 128 bit "ints"/"doubles" become common
        // enough that they can be stored in 3dm files.
        // It may also happen that third party applications
        // on specialized CPUs need to toggle byte order
        // for 128 bit ints/doubles stored as user data.
        size_t i;
        while(b < b1)
        {
          for (i = 0; i < sizeof_element; i++)
            c[i] = *a++;
          while(i--)
            *b++ = c[i];
        }
      }
      else
      {
        rc = false;
      }
      break;
    }
  }
  return rc;
}